

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box_Hierarchy.cpp
# Opt level: O1

void __thiscall
Nova::Box_Hierarchy<float,_3>::Intersection_List
          (Box_Hierarchy<float,_3> *this,TV *X,Array<int> *intersection_list)

{
  Box_Hierarchy<float,_3> *pBVar1;
  iterator __position;
  bool bVar2;
  pointer piVar3;
  pointer ppBVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Array<const_Nova::Box_Hierarchy<float,_3>_*> stack;
  Box_Hierarchy<float,_3> **local_58;
  iterator iStack_50;
  Box_Hierarchy<float,_3> **local_48;
  TV *local_40;
  Box_Hierarchy<float,_3> *local_38;
  
  local_58 = (Box_Hierarchy<float,_3> **)0x0;
  iStack_50._M_current = (Box_Hierarchy<float,_3> **)0x0;
  local_48 = (Box_Hierarchy<float,_3> **)0x0;
  local_40 = X;
  local_38 = this;
  std::vector<Nova::Box_Hierarchy<float,3>const*,std::allocator<Nova::Box_Hierarchy<float,3>const*>>
  ::_M_realloc_insert<Nova::Box_Hierarchy<float,3>const*const&>
            ((vector<Nova::Box_Hierarchy<float,3>const*,std::allocator<Nova::Box_Hierarchy<float,3>const*>>
              *)&local_58,(iterator)0x0,&local_38);
  if (local_58 != iStack_50._M_current) {
    do {
      pBVar1 = iStack_50._M_current[-1];
      iStack_50._M_current = iStack_50._M_current + -1;
      bVar2 = Range<float,_3>::Inside(&(pBVar1->box).super_Range<float,_3>,local_40);
      if (bVar2) {
        piVar3 = (pBVar1->index)._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = (long)(pBVar1->index)._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3;
        if (lVar5 != 0) {
          uVar6 = lVar5 >> 2;
          lVar5 = 0;
          uVar7 = 0;
          do {
            if (uVar6 <= (ulong)(lVar5 >> 0x20)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            __position._M_current =
                 (intersection_list->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (intersection_list->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)intersection_list,__position,
                         piVar3 + (lVar5 >> 0x20));
            }
            else {
              *__position._M_current = piVar3[lVar5 >> 0x20];
              (intersection_list->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar7 = uVar7 + 1;
            piVar3 = (pBVar1->index)._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = (long)(pBVar1->index)._data.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
            lVar5 = lVar5 + 0x100000000;
          } while (uVar7 < uVar6);
        }
        ppBVar4 = (pBVar1->children)._data.
                  super__Vector_base<Nova::Box_Hierarchy<float,_3>_*,_std::allocator<Nova::Box_Hierarchy<float,_3>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(pBVar1->children)._data.
                      super__Vector_base<Nova::Box_Hierarchy<float,_3>_*,_std::allocator<Nova::Box_Hierarchy<float,_3>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4;
        if (lVar5 != 0) {
          uVar6 = lVar5 >> 3;
          lVar5 = 0;
          uVar7 = 0;
          do {
            if (uVar6 <= (ulong)(lVar5 >> 0x20)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            if (iStack_50._M_current == local_48) {
              std::
              vector<Nova::Box_Hierarchy<float,3>const*,std::allocator<Nova::Box_Hierarchy<float,3>const*>>
              ::_M_realloc_insert<Nova::Box_Hierarchy<float,3>const*const&>
                        ((vector<Nova::Box_Hierarchy<float,3>const*,std::allocator<Nova::Box_Hierarchy<float,3>const*>>
                          *)&local_58,iStack_50,ppBVar4 + (lVar5 >> 0x20));
            }
            else {
              *iStack_50._M_current = ppBVar4[lVar5 >> 0x20];
              iStack_50._M_current = iStack_50._M_current + 1;
            }
            uVar7 = uVar7 + 1;
            ppBVar4 = (pBVar1->children)._data.
                      super__Vector_base<Nova::Box_Hierarchy<float,_3>_*,_std::allocator<Nova::Box_Hierarchy<float,_3>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = (long)(pBVar1->children)._data.
                          super__Vector_base<Nova::Box_Hierarchy<float,_3>_*,_std::allocator<Nova::Box_Hierarchy<float,_3>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4 >> 3;
            lVar5 = lVar5 + 0x100000000;
          } while (uVar7 < uVar6);
        }
      }
    } while (local_58 != iStack_50._M_current);
  }
  if (local_58 != (Box_Hierarchy<float,_3> **)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void Box_Hierarchy<T,d>::
Intersection_List(const TV& X,Array<int>& intersection_list)
{
    Array<const Box_Hierarchy<T,d>*> stack;
    stack.Append(this);
    while(!stack.Empty()){const Box_Hierarchy<T,d>* node=stack.Back();
        stack.Pop_Back();
        // check if node is a leaf and if there is an intersection
        if(node->box.Inside(X)){
            for(size_t i=0;i<node->index.size();++i) intersection_list.Append(node->index[i]);

            // push children of the node on the stack
            for(size_t i=0;i<node->children.size();++i) stack.Append(node->children[i]);}}
}